

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O0

void getter_thread_body(void *arg)

{
  int iVar1;
  char local_218 [8];
  char buffer [512];
  void *arg_local;
  
  do {
    iVar1 = uv_get_process_title(local_218,0x200);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,0x2d,"0 == uv_get_process_title(buffer, sizeof(buffer))");
      abort();
    }
    iVar1 = strcmp(local_218,titles[0]);
    if (iVar1 != 0) {
      iVar1 = strcmp(local_218,titles[1]);
      if (iVar1 != 0) {
        iVar1 = strcmp(local_218,titles[2]);
        if (iVar1 != 0) {
          iVar1 = strcmp(local_218,titles[3]);
          if (iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
                    ,0x32,
                    "0 == strcmp(buffer, titles[0]) || 0 == strcmp(buffer, titles[1]) || 0 == strcmp(buffer, titles[2]) || 0 == strcmp(buffer, titles[3])"
                   );
            abort();
          }
        }
      }
    }
    uv_sleep(0);
  } while( true );
}

Assistant:

static void getter_thread_body(void* arg) {
  char buffer[512];

  for (;;) {
    ASSERT(0 == uv_get_process_title(buffer, sizeof(buffer)));
    ASSERT(
      0 == strcmp(buffer, titles[0]) ||
      0 == strcmp(buffer, titles[1]) ||
      0 == strcmp(buffer, titles[2]) ||
      0 == strcmp(buffer, titles[3]));

    uv_sleep(0);
  }
}